

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O2

void __thiscall util::TraceThread(util *this,string_view thread_name,function<void_()> thread_func)

{
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  allocator<char> local_49;
  string_view thread_name_local;
  string local_38;
  long local_18;
  
  thread_name_local._M_str = (char *)thread_name._M_len;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  thread_name_local._M_len = (size_t)this;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_38,&thread_name_local,&local_49);
  ThreadRename(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  logging_function._M_str = "TraceThread";
  logging_function._M_len = 0xb;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/util/thread.cpp"
  ;
  source_file._M_len = 0x5f;
  LogPrintFormatInternal<std::basic_string_view<char,std::char_traits<char>>>
            (logging_function,source_file,0x14,ALL,Info,(ConstevalFormatString<1U>)0x73535f,
             &thread_name_local);
  std::function<void_()>::operator()((function<void_()> *)thread_name._M_str);
  logging_function_00._M_str = "TraceThread";
  logging_function_00._M_len = 0xb;
  source_file_00._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/util/thread.cpp"
  ;
  source_file_00._M_len = 0x5f;
  LogPrintFormatInternal<std::basic_string_view<char,std::char_traits<char>>>
            (logging_function_00,source_file_00,0x16,ALL,Info,(ConstevalFormatString<1U>)0x735370,
             &thread_name_local);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void util::TraceThread(std::string_view thread_name, std::function<void()> thread_func)
{
    util::ThreadRename(std::string{thread_name});
    try {
        LogPrintf("%s thread start\n", thread_name);
        thread_func();
        LogPrintf("%s thread exit\n", thread_name);
    } catch (const std::exception& e) {
        PrintExceptionContinue(&e, thread_name);
        throw;
    } catch (...) {
        PrintExceptionContinue(nullptr, thread_name);
        throw;
    }
}